

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsTest.cpp
# Opt level: O3

void __thiscall
jaegertracing::metrics::MetricsTest_testTimer_Test::~MetricsTest_testTimer_Test
          (MetricsTest_testTimer_Test *this)

{
  *(undefined ***)&this->super_MetricsTest = &PTR__MetricsTest_0020c0c8;
  std::
  unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
  ::~unique_ptr(&(this->super_MetricsTest)._metrics);
  InMemoryStatsReporter::~InMemoryStatsReporter(&(this->super_MetricsTest)._metricsReporter);
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(MetricsTest, testTimer)
{
    constexpr auto timeValue = static_cast<int64_t>(5);
    constexpr auto metricName = "jaeger.test-timer";
    StatsFactoryImpl factory(_metricsReporter);
    auto timer = factory.createTimer(metricName);
    timer->record(timeValue);
    const auto& timers = _metricsReporter.timers();
    ASSERT_EQ(1, timers.size());
    auto itr = timers.find(metricName);
    ASSERT_TRUE(itr != std::end(timers));
    ASSERT_EQ(timeValue, itr->second);
}